

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

spv_result_t
spvBinaryHeaderGet(spv_const_binary binary,spv_endianness_t endian,spv_header_t *pHeader)

{
  uint32_t uVar1;
  spv_result_t sVar2;
  
  sVar2 = SPV_ERROR_INVALID_BINARY;
  if ((binary->code != (uint32_t *)0x0) && (4 < binary->wordCount)) {
    if (pHeader == (spv_header_t *)0x0) {
      sVar2 = SPV_ERROR_INVALID_POINTER;
    }
    else {
      uVar1 = spvFixWord(*binary->code,endian);
      pHeader->magic = uVar1;
      uVar1 = spvFixWord(binary->code[1],endian);
      pHeader->version = uVar1;
      if (0xfffff9fe < uVar1 - 0x10601 && (uVar1 & 0xff0000ff) == 0) {
        uVar1 = spvFixWord(binary->code[2],endian);
        pHeader->generator = uVar1;
        uVar1 = spvFixWord(binary->code[3],endian);
        pHeader->bound = uVar1;
        uVar1 = spvFixWord(binary->code[4],endian);
        pHeader->schema = uVar1;
        pHeader->instructions = binary->code + 5;
        sVar2 = SPV_SUCCESS;
      }
    }
  }
  return sVar2;
}

Assistant:

spv_result_t spvBinaryHeaderGet(const spv_const_binary binary,
                                const spv_endianness_t endian,
                                spv_header_t* pHeader) {
  if (!binary->code) return SPV_ERROR_INVALID_BINARY;
  if (binary->wordCount < SPV_INDEX_INSTRUCTION)
    return SPV_ERROR_INVALID_BINARY;
  if (!pHeader) return SPV_ERROR_INVALID_POINTER;

  // TODO: Validation checking?
  pHeader->magic = spvFixWord(binary->code[SPV_INDEX_MAGIC_NUMBER], endian);
  pHeader->version = spvFixWord(binary->code[SPV_INDEX_VERSION_NUMBER], endian);
  // Per 2.3.1 version's high and low bytes are 0
  if ((pHeader->version & 0x000000ff) || pHeader->version & 0xff000000)
    return SPV_ERROR_INVALID_BINARY;
  // Minimum version was 1.0 and max version is defined by SPV_VERSION.
  if (pHeader->version < SPV_SPIRV_VERSION_WORD(1, 0) ||
      pHeader->version > SPV_VERSION)
    return SPV_ERROR_INVALID_BINARY;

  pHeader->generator =
      spvFixWord(binary->code[SPV_INDEX_GENERATOR_NUMBER], endian);
  pHeader->bound = spvFixWord(binary->code[SPV_INDEX_BOUND], endian);
  pHeader->schema = spvFixWord(binary->code[SPV_INDEX_SCHEMA], endian);
  pHeader->instructions = &binary->code[SPV_INDEX_INSTRUCTION];

  return SPV_SUCCESS;
}